

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O0

tuple<double,_baryonyx::show_size_type> __thiscall
baryonyx::memory_consumed_size<unsigned_long>(baryonyx *this,unsigned_long size)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 in_ZMM0 [64];
  tuple<double,_baryonyx::show_size_type> tVar3;
  show_size_type local_4c;
  double local_48;
  show_size_type local_3c [3];
  double local_30;
  double gb;
  double mb;
  double kb;
  unsigned_long size_local;
  
  auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,size);
  auVar2._0_8_ = auVar2._0_8_ / 1024.0;
  gb = auVar2._0_8_ / 1024.0;
  local_30 = gb / 1024.0;
  mb = auVar2._0_8_;
  kb = (double)size;
  size_local = (unsigned_long)this;
  if (local_30 <= 0.5) {
    if (gb <= 0.5) {
      auVar2._8_8_ = 0;
      if (auVar2._0_8_ <= 0.5) {
        auVar2 = vcvtusi2sd_avx512f(auVar2,size);
        local_48 = auVar2._0_8_;
        local_4c = B;
        dVar1 = local_48;
        std::tuple<double,_baryonyx::show_size_type>::tuple<double,_baryonyx::show_size_type,_true>
                  ((tuple<double,_baryonyx::show_size_type> *)this,&local_48,&local_4c);
        local_30 = dVar1;
      }
      else {
        local_3c[0] = KB;
        dVar1 = auVar2._0_8_;
        std::tuple<double,_baryonyx::show_size_type>::
        tuple<const_double_&,_baryonyx::show_size_type,_true>
                  ((tuple<double,_baryonyx::show_size_type> *)this,&mb,local_3c);
        local_30 = dVar1;
      }
    }
    else {
      local_3c[1] = 1;
      dVar1 = gb;
      std::tuple<double,_baryonyx::show_size_type>::
      tuple<const_double_&,_baryonyx::show_size_type,_true>
                ((tuple<double,_baryonyx::show_size_type> *)this,&gb,local_3c + 1);
      local_30 = dVar1;
    }
  }
  else {
    local_3c[2] = 0;
    std::tuple<double,_baryonyx::show_size_type>::
    tuple<const_double_&,_baryonyx::show_size_type,_true>
              ((tuple<double,_baryonyx::show_size_type> *)this,&local_30,local_3c + 2);
  }
  tVar3.super__Tuple_impl<0UL,_double,_baryonyx::show_size_type>.
  super__Head_base<0UL,_double,_false>._M_head_impl = local_30;
  tVar3.super__Tuple_impl<0UL,_double,_baryonyx::show_size_type>._0_8_ = this;
  return (tuple<double,_baryonyx::show_size_type>)
         tVar3.super__Tuple_impl<0UL,_double,_baryonyx::show_size_type>;
}

Assistant:

inline std::tuple<double, show_size_type>
memory_consumed_size(T size) noexcept
{
    static_assert(
      (std::is_integral<T>::value || std::is_floating_point<T>::value),
      "Integer or real required.");

    const auto kb = static_cast<double>(size) / 1024.;
    const auto mb = kb / 1024.;
    const auto gb = mb / 1024.;

    if (gb > 0.5)
        return { gb, show_size_type::GB };

    if (mb > 0.5)
        return { mb, show_size_type::MB };

    if (kb > 0.5)
        return { kb, show_size_type::KB };

    return { static_cast<double>(size), show_size_type::B };
}